

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O2

void __thiscall
TPZFileStream::WriteData<TFad<10,double>>(TPZFileStream *this,TFad<10,_double> *p,int howMany)

{
  ostream *poVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < howMany) {
    uVar2 = (ulong)(uint)howMany;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    poVar1 = ::operator<<((ostream *)&this->fOut,p);
    std::endl<char,std::char_traits<char>>(poVar1);
    p = p + 0x60;
  }
  return;
}

Assistant:

void  TPZFileStream::WriteData(const T *p, int howMany){
        for(int c=0; c<howMany; c++) fOut << p[c] << std::endl;
#ifdef PZDEBUG
        if (fOut.bad()) {
            PZError << "TFileStream:Could not write to stream" << std::endl;
            DebugStop();
        }
#endif
    }